

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall GlobOpt::TryReplaceLdLen(GlobOpt *this,Instr **instr)

{
  Opnd *this_00;
  Sym *this_01;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  SymOpnd *pSVar4;
  undefined4 *puVar5;
  PropertySym *pPVar6;
  RegOpnd *this_02;
  Value *pVVar7;
  ValueType *this_03;
  
  if ((((*instr)->m_opcode != LdLen_A) || (this_00 = (*instr)->m_src1, this_00 == (Opnd *)0x0)) ||
     (bVar2 = IR::Opnd::IsSymOpnd(this_00), !bVar2)) {
    return;
  }
  pSVar4 = IR::Opnd::AsSymOpnd((*instr)->m_src1);
  this_01 = pSVar4->m_sym;
  if (this_01->m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x983,"(sym->IsPropertySym())","sym->IsPropertySym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pPVar6 = Sym::AsPropertySym(this_01);
  this_02 = IR::RegOpnd::New(pPVar6->m_stackSym,TyVar,(*instr)->m_func);
  pVVar7 = GlobOptBlockData::FindValue
                     (&this->currentBlock->globOptData,&pPVar6->m_stackSym->super_Sym);
  this_03 = &pVVar7->valueInfo->super_ValueType;
  bVar2 = ValueType::IsLikelyAnyArray(this_03);
  if ((((!bVar2) && (bVar2 = ValueType::HasHadStringTag(this_03), !bVar2)) &&
      ((bVar2 = ValueType::IsLikelyString(this_03), !bVar2 &&
       (bVar2 = IR::Opnd::IsArgumentsObject(&this_02->super_Opnd), !bVar2)))) &&
     (((this->currentBlock->globOptData).argObjSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0 ||
      (BVar3 = GlobOptBlockData::IsArgumentsOpnd
                         (&this->currentBlock->globOptData,&this_02->super_Opnd), BVar3 == 0)))) {
    (*instr)->m_opcode = LdFld;
    return;
  }
  IR::Opnd::SetIsJITOptimizedReg
            (&this_02->super_Opnd,(bool)(((pSVar4->super_Opnd).field_0xb & 8) >> 3));
  IR::Opnd::SetValueType
            (&this_02->super_Opnd,
             (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&(this_03->field_0).field_0);
  (this_02->super_Opnd).field_0xb =
       (this_02->super_Opnd).field_0xb & 0xfb | (pSVar4->super_Opnd).field_0xb & 4;
  IR::Instr::ReplaceSrc1(*instr,&this_02->super_Opnd);
  return;
}

Assistant:

void
GlobOpt::TryReplaceLdLen(IR::Instr *& instr)
{
    // Change LdLen on objects other than arrays, strings, and 'arguments' to LdFld. Otherwise, convert the SymOpnd to a RegOpnd here.
    if (instr->m_opcode == Js::OpCode::LdLen_A && instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd())
    {
        IR::SymOpnd * opnd = instr->GetSrc1()->AsSymOpnd();
        Sym *sym = opnd->m_sym;
        Assert(sym->IsPropertySym());
        PropertySym *originalPropertySym = sym->AsPropertySym();

        IR::RegOpnd* newopnd = IR::RegOpnd::New(originalPropertySym->m_stackSym, IRType::TyVar, instr->m_func);
        ValueInfo *const objectValueInfo = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym)->GetValueInfo();
        // things we'd emit a fast path for
        if (
            objectValueInfo->IsLikelyAnyArray() ||
            objectValueInfo->HasHadStringTag() ||
            objectValueInfo->IsLikelyString() ||
            newopnd->IsArgumentsObject() ||
            (CurrentBlockData()->argObjSyms && CurrentBlockData()->IsArgumentsOpnd(newopnd))
            )
        {
            // We need to properly transfer over the information from the old operand, which is
            // a SymOpnd, to the new one, which is a RegOpnd. Unfortunately, the types mean the
            // normal copy methods won't work here, so we're going to directly copy data.
            newopnd->SetIsJITOptimizedReg(opnd->GetIsJITOptimizedReg());
            newopnd->SetValueType(objectValueInfo->Type());
            newopnd->SetIsDead(opnd->GetIsDead());
            instr->ReplaceSrc1(newopnd);
        }
        else
        {
            // otherwise, change the instruction to an LdFld here.
            instr->m_opcode = Js::OpCode::LdFld;
        }
    }
}